

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameters.h
# Opt level: O3

void __thiscall
flagser_parameters::flagser_parameters(flagser_parameters *this,named_arguments_t *named_arguments)

{
  filtration_algorithm_t *pfVar1;
  long *plVar2;
  _Alloc_hider __nptr;
  bool bVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  const_iterator cVar7;
  filtration_algorithm_t *pfVar8;
  int *piVar9;
  undefined8 uVar10;
  char *pcVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  value_t vVar13;
  string parameter;
  key_type local_140;
  string *local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  string *local_f0;
  string *local_e8;
  pointer local_e0;
  string *local_d8;
  key_type local_d0;
  key_type local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this->max_dimension = 0xffff;
  this->min_dimension = 0;
  this->modulus = 2;
  this->threshold = 3.4028235e+38;
  this->split_into_connected_components = false;
  this->directed = false;
  this->approximate_computation = false;
  this->in_memory = false;
  this->max_entries = 0xffffffffffffffff;
  uVar4 = std::thread::hardware_concurrency();
  this->nb_threads = (ulong)uVar4;
  local_f0 = &this->input_format;
  local_f8 = &(this->input_format).field_2;
  (this->input_format)._M_dataplus._M_p = (pointer)local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"flagser","");
  local_e8 = &this->output_name;
  local_100 = &(this->output_name).field_2;
  (this->output_name)._M_dataplus._M_p = (pointer)local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"");
  local_120 = &this->output_format;
  local_108 = &(this->output_format).field_2;
  (this->output_format)._M_dataplus._M_p = (pointer)local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"barcode","");
  local_110 = &(this->cache).field_2;
  (this->cache)._M_dataplus._M_p = (pointer)local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->cache,"");
  local_118 = &(this->hdf5_type).field_2;
  (this->hdf5_type)._M_dataplus._M_p = (pointer)local_118;
  local_d8 = &this->cache;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->hdf5_type,"");
  (this->filtration_algorithm)._M_t.
  super___uniq_ptr_impl<filtration_algorithm_t,_std::default_delete<filtration_algorithm_t>_>._M_t.
  super__Tuple_impl<0UL,_filtration_algorithm_t_*,_std::default_delete<filtration_algorithm_t>_>.
  super__Head_base<0UL,_filtration_algorithm_t_*,_false>._M_head_impl =
       (filtration_algorithm_t *)0x0;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"out","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"Please provide an output filename via \"--out filename\" .","");
  pcVar6 = get_argument_or_fail(named_arguments,&local_70,&local_90);
  pcVar11 = (char *)(this->output_name)._M_string_length;
  strlen(pcVar6);
  std::__cxx11::string::_M_replace((ulong)local_e8,0,pcVar11,(ulong)pcVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  paVar12 = &local_140.field_2;
  local_140._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"in-format","");
  cVar7 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&named_arguments->_M_h,&local_140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar12) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if (cVar7.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
      ._M_cur != (__node_type *)0x0) {
    pcVar11 = *(char **)((long)cVar7.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
                               ._M_cur + 0x28);
    pcVar6 = (char *)(this->input_format)._M_string_length;
    strlen(pcVar11);
    std::__cxx11::string::_M_replace((ulong)local_f0,0,pcVar6,(ulong)pcVar11);
  }
  local_140._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"out-format","");
  cVar7 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&named_arguments->_M_h,&local_140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar12) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if (cVar7.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
      ._M_cur != (__node_type *)0x0) {
    pcVar11 = *(char **)((long)cVar7.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
                               ._M_cur + 0x28);
    pcVar6 = (char *)(this->output_format)._M_string_length;
    strlen(pcVar11);
    std::__cxx11::string::_M_replace((ulong)local_120,0,pcVar6,(ulong)pcVar11);
  }
  local_140._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"approximate","");
  cVar7 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&named_arguments->_M_h,&local_140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar12) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if (cVar7.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
      ._M_cur != (__node_type *)0x0) {
    iVar5 = atoi(*(char **)((long)cVar7.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
                                  ._M_cur + 0x28));
    this->max_entries = (long)iVar5;
    this->approximate_computation = true;
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"undirected","");
  cVar7 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&named_arguments->_M_h,&local_b0);
  if (cVar7.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
      ._M_cur == (__node_type *)0x0) {
    pcVar11 = "directed";
  }
  else {
    pcVar11 = *(char **)((long)cVar7.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
                               ._M_cur + 0x28);
  }
  std::__cxx11::string::string((string *)&local_140,pcVar11,(allocator *)&local_e0);
  iVar5 = std::__cxx11::string::compare((char *)&local_140);
  this->directed = iVar5 != 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  paVar12 = &local_140.field_2;
  local_140._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"components","");
  cVar7 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&named_arguments->_M_h,&local_140);
  this->split_into_connected_components =
       cVar7.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
       ._M_cur != (__node_type *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar12) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  local_140._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"max-dim","");
  cVar7 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&named_arguments->_M_h,&local_140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar12) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if (cVar7.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
      ._M_cur != (__node_type *)0x0) {
    iVar5 = atoi(*(char **)((long)cVar7.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
                                  ._M_cur + 0x28));
    this->max_dimension = (unsigned_short)iVar5;
  }
  local_140._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"min-dim","");
  cVar7 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&named_arguments->_M_h,&local_140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar12) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if (cVar7.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
      ._M_cur != (__node_type *)0x0) {
    iVar5 = atoi(*(char **)((long)cVar7.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
                                  ._M_cur + 0x28));
    this->min_dimension = (unsigned_short)iVar5;
  }
  bVar3 = has_zero_filtration_and_no_explicit_output(this,named_arguments);
  if (bVar3) {
    std::__cxx11::string::_M_replace
              ((ulong)local_120,0,(char *)(this->output_format)._M_string_length,0x146322);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"filtration","");
  cVar7 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&named_arguments->_M_h,&local_d0);
  if (cVar7.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
      ._M_cur == (__node_type *)0x0) {
    pcVar11 = "zero";
  }
  else {
    pcVar11 = *(char **)((long)cVar7.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
                               ._M_cur + 0x28);
  }
  std::__cxx11::string::string((string *)&local_50,pcVar11,(allocator *)&local_140);
  pfVar8 = get_filtration_computer(&local_50);
  pfVar1 = (this->filtration_algorithm)._M_t.
           super___uniq_ptr_impl<filtration_algorithm_t,_std::default_delete<filtration_algorithm_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_filtration_algorithm_t_*,_std::default_delete<filtration_algorithm_t>_>
           .super__Head_base<0UL,_filtration_algorithm_t_*,_false>._M_head_impl;
  (this->filtration_algorithm)._M_t.
  super___uniq_ptr_impl<filtration_algorithm_t,_std::default_delete<filtration_algorithm_t>_>._M_t.
  super__Tuple_impl<0UL,_filtration_algorithm_t_*,_std::default_delete<filtration_algorithm_t>_>.
  super__Head_base<0UL,_filtration_algorithm_t_*,_false>._M_head_impl = pfVar8;
  if (pfVar1 != (filtration_algorithm_t *)0x0) {
    (*pfVar1->_vptr_filtration_algorithm_t[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  local_140._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"threshold","");
  cVar7 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&named_arguments->_M_h,&local_140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar12) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if (cVar7.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
      ._M_cur == (__node_type *)0x0) goto LAB_0012a301;
  std::__cxx11::string::string
            ((string *)&local_140,
             *(char **)((long)cVar7.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
                              ._M_cur + 0x28),(allocator *)&local_e0);
  __nptr._M_p = local_140._M_dataplus._M_p;
  piVar9 = __errno_location();
  iVar5 = *piVar9;
  *piVar9 = 0;
  vVar13 = strtof(__nptr._M_p,&local_e0);
  if (local_e0 == __nptr._M_p) {
    uVar10 = std::__throw_invalid_argument("stof");
    pfVar1 = (this->filtration_algorithm)._M_t.
             super___uniq_ptr_impl<filtration_algorithm_t,_std::default_delete<filtration_algorithm_t>_>
             ._M_t.
             super__Tuple_impl<0UL,_filtration_algorithm_t_*,_std::default_delete<filtration_algorithm_t>_>
             .super__Head_base<0UL,_filtration_algorithm_t_*,_false>._M_head_impl;
    if (pfVar1 != (filtration_algorithm_t *)0x0) {
      (*pfVar1->_vptr_filtration_algorithm_t[1])();
    }
    (this->filtration_algorithm)._M_t.
    super___uniq_ptr_impl<filtration_algorithm_t,_std::default_delete<filtration_algorithm_t>_>._M_t
    .super__Tuple_impl<0UL,_filtration_algorithm_t_*,_std::default_delete<filtration_algorithm_t>_>.
    super__Head_base<0UL,_filtration_algorithm_t_*,_false>._M_head_impl =
         (filtration_algorithm_t *)0x0;
    plVar2 = (long *)(this->hdf5_type)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar2 != local_118) {
      operator_delete(plVar2,local_118->_M_allocated_capacity + 1);
    }
    plVar2 = (long *)(local_d8->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar2 != local_110) {
      operator_delete(plVar2,local_110->_M_allocated_capacity + 1);
    }
    plVar2 = (long *)(local_120->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar2 != local_108) {
      operator_delete(plVar2,local_108->_M_allocated_capacity + 1);
    }
    plVar2 = (long *)(local_e8->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar2 != local_100) {
      operator_delete(plVar2,local_100->_M_allocated_capacity + 1);
    }
    plVar2 = (long *)(local_f0->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar2 != local_f8) {
      operator_delete(plVar2,local_f8->_M_allocated_capacity + 1);
    }
    _Unwind_Resume(uVar10);
  }
  if (*piVar9 == 0) {
LAB_0012a2e0:
    *piVar9 = iVar5;
  }
  else if (*piVar9 == 0x22) {
    vVar13 = (value_t)std::__throw_out_of_range("stof");
    goto LAB_0012a2e0;
  }
  this->threshold = vVar13;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
LAB_0012a301:
  paVar12 = &local_140.field_2;
  local_140._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"threads","");
  cVar7 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&named_arguments->_M_h,&local_140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar12) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if (cVar7.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
      ._M_cur != (__node_type *)0x0) {
    iVar5 = atoi(*(char **)((long)cVar7.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
                                  ._M_cur + 0x28));
    this->nb_threads = (long)iVar5;
  }
  local_140._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"in-memory","");
  cVar7 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&named_arguments->_M_h,&local_140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar12) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if (cVar7.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
      ._M_cur != (__node_type *)0x0) {
    this->in_memory = true;
  }
  return;
}

Assistant:

flagser_parameters(const named_arguments_t& named_arguments) {
		named_arguments_t::const_iterator it;

		output_name =
		    get_argument_or_fail(named_arguments, "out", "Please provide an output filename via \"--out filename\" .");

		if ((it = named_arguments.find("in-format")) != named_arguments.end()) { input_format = it->second; }

		if ((it = named_arguments.find("out-format")) != named_arguments.end()) { output_format = it->second; }

		if ((it = named_arguments.find("approximate")) != named_arguments.end()) {
			max_entries = atoi(it->second);
			approximate_computation = true;
		}

		directed = std::string(get_argument_or_default(named_arguments, "undirected", "directed")) != "true";

		split_into_connected_components = named_arguments.find("components") != named_arguments.end();

		if ((it = named_arguments.find("max-dim")) != named_arguments.end()) { max_dimension = atoi(it->second); }

		if ((it = named_arguments.find("min-dim")) != named_arguments.end()) { min_dimension = atoi(it->second); }

		if (has_zero_filtration_and_no_explicit_output(named_arguments)) { output_format = "betti"; }

		filtration_algorithm.reset(
		    get_filtration_computer(get_argument_or_default(named_arguments, "filtration", "zero")));

		if ((it = named_arguments.find("threshold")) != named_arguments.end()) {
			std::string parameter = std::string(it->second);
			threshold = std::stof(parameter, nullptr);
		}

		if ((it = named_arguments.find("threads")) != named_arguments.end()) { nb_threads = atoi(it->second); }

		if ((it = named_arguments.find("in-memory")) != named_arguments.end()) { in_memory = true; }

#ifdef USE_COEFFICIENTS
		if ((it = named_arguments.find("modulus")) != named_arguments.end()) { modulus = atoi(it->second); }
#endif
	}